

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_recv(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  nn_sockbase *local_38;
  nn_respondent *respondent;
  int rc;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  if (((ulong)local_38[0x1b].vfptr & 1) != 0) {
    nn_chunkref_term((nn_chunkref *)&local_38[0x1b].sock);
    *(uint *)&local_38[0x1b].vfptr = *(uint *)&local_38[0x1b].vfptr & 0xfffffffe;
  }
  iVar1 = nn_xrespondent_recv(local_38,msg);
  __stream = _stderr;
  if (iVar1 == -0xb) {
    self_local._4_4_ = -0xb;
  }
  else {
    if (iVar1 != 0) {
      pcVar2 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/respondent.c"
              ,0x98);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_mv((nn_chunkref *)&local_38[0x1b].sock,&msg->sphdr);
    nn_chunkref_init(&msg->sphdr,0);
    *(uint *)&local_38[0x1b].vfptr = *(uint *)&local_38[0x1b].vfptr | 1;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_respondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  Cancel current survey and clean up backtrace, if it exists. */
    if (nn_slow (respondent->flags & NN_RESPONDENT_INPROGRESS)) {
        nn_chunkref_term (&respondent->backtrace);
        respondent->flags &= ~NN_RESPONDENT_INPROGRESS;
    }

    /*  Get next survey. */
    rc = nn_xrespondent_recv (&respondent->xrespondent.sockbase, msg);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc == 0, -rc);

    /*  Store the backtrace. */
    nn_chunkref_mv (&respondent->backtrace, &msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 0);

    /*  Remember that survey is being processed. */
    respondent->flags |= NN_RESPONDENT_INPROGRESS;

    return 0;
}